

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::str_writer<wchar_t>>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>> *this,
          size_t size,align_spec *spec,str_writer<wchar_t> f)

{
  wchar_t wVar1;
  undefined8 *puVar2;
  wchar_t *__src;
  long lVar3;
  void *__dest;
  void *pvVar4;
  size_t sVar5;
  ulong uVar6;
  basic_buffer<wchar_t> *c;
  ulong uVar7;
  ulong uVar8;
  wchar_t __tmp;
  
  sVar5 = f.size;
  __src = f.s;
  uVar8 = (ulong)spec->width_;
  puVar2 = *(undefined8 **)this;
  lVar3 = puVar2[2];
  uVar6 = uVar8 - size;
  if (uVar8 < size || uVar6 == 0) {
    if ((ulong)puVar2[3] < size + lVar3) {
      (**(code **)*puVar2)(puVar2);
    }
    puVar2[2] = size + lVar3;
    if (sVar5 != 0) {
      pvVar4 = (void *)(lVar3 * 4 + puVar2[1]);
LAB_00134a34:
      memmove(pvVar4,__src,sVar5 << 2);
      return;
    }
  }
  else {
    uVar7 = lVar3 + uVar8;
    if ((ulong)puVar2[3] < uVar7) {
      (**(code **)*puVar2)(puVar2,uVar7);
    }
    puVar2[2] = uVar7;
    __dest = (void *)(lVar3 * 4 + puVar2[1]);
    wVar1 = spec->fill_;
    if (spec->align_ == ALIGN_CENTER) {
      uVar7 = uVar6 >> 1;
      pvVar4 = __dest;
      if (1 < uVar6) {
        pvVar4 = (void *)((long)__dest + uVar7 * 4);
        lVar3 = 0;
        do {
          *(wchar_t *)((long)__dest + lVar3) = wVar1;
          lVar3 = lVar3 + 4;
        } while (uVar7 * 4 - lVar3 != 0);
      }
      if (sVar5 != 0) {
        memmove(pvVar4,__src,sVar5 * 4);
        pvVar4 = (void *)((long)pvVar4 + sVar5 * 4);
      }
      if (uVar8 != size) {
        lVar3 = 0;
        do {
          *(wchar_t *)((long)pvVar4 + lVar3) = wVar1;
          lVar3 = lVar3 + 4;
        } while (uVar8 * 4 + size * -4 + uVar7 * -4 != lVar3);
      }
    }
    else if (spec->align_ == ALIGN_RIGHT) {
      pvVar4 = __dest;
      if (uVar8 != size) {
        pvVar4 = (void *)((long)__dest + uVar6 * 4);
        lVar3 = 0;
        do {
          *(wchar_t *)((long)__dest + lVar3) = wVar1;
          lVar3 = lVar3 + 4;
        } while (uVar8 * 4 + size * -4 != lVar3);
      }
      if (sVar5 != 0) goto LAB_00134a34;
    }
    else {
      if (sVar5 != 0) {
        memmove(__dest,__src,sVar5 * 4);
        __dest = (void *)((long)__dest + sVar5 * 4);
      }
      if (uVar8 != size) {
        lVar3 = 0;
        do {
          *(wchar_t *)((long)__dest + lVar3) = wVar1;
          lVar3 = lVar3 + 4;
        } while (uVar8 * 4 + size * -4 != lVar3);
      }
    }
  }
  return;
}

Assistant:

void basic_writer<Range>::write_padded(
    std::size_t size, const align_spec &spec, F f) {
  unsigned width = spec.width();
  if (width <= size)
    return f(reserve(size));
  auto &&it = reserve(width);
  char_type fill = static_cast<char_type>(spec.fill());
  std::size_t padding = width - size;
  if (spec.align() == ALIGN_RIGHT) {
    it = std::fill_n(it, padding, fill);
    f(it);
  } else if (spec.align() == ALIGN_CENTER) {
    std::size_t left_padding = padding / 2;
    it = std::fill_n(it, left_padding, fill);
    f(it);
    it = std::fill_n(it, padding - left_padding, fill);
  } else {
    f(it);
    it = std::fill_n(it, padding, fill);
  }
}